

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentLexer.cxx
# Opt level: O2

void cmCommandArgument_SetupEscapes(yyscan_t yyscanner,bool noEscapes)

{
  undefined7 in_register_00000031;
  
  *(int *)((long)yyscanner + 0x4c) = (int)CONCAT71(in_register_00000031,noEscapes) * 2 + 3;
  return;
}

Assistant:

void cmCommandArgument_SetupEscapes(yyscan_t yyscanner, bool noEscapes)
{
  /* Hack into the internal flex-generated scanner to set the state.  */
  struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
  if(noEscapes) {
    BEGIN(NOESCAPES);
  } else {
    BEGIN(ESCAPES);
  }
}